

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkStartNameIds(Abc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint i_00;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *__stream;
  Vec_Int_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar8;
  int local_420;
  int local_41c;
  int Counter;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  FILE *pFile;
  char pFileName [1000];
  Abc_Ntk_t *p_local;
  
  local_420 = 1;
  pFileName._992_8_ = p;
  iVar1 = Abc_NtkIsNetlist(p);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2a9,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  if (*(long *)(pFileName._992_8_ + 0x1b8) != 0) {
    __assert_fail("p->vNameIds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2aa,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  sVar3 = strlen(*(char **)(pFileName._992_8_ + 0x10));
  if (999 < sVar3) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2ab,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  pcVar4 = Extra_FileNameGenericAppend(*(char **)(pFileName._992_8_ + 0x10),"");
  pcVar5 = Extra_FileNameExtension(*(char **)(pFileName._992_8_ + 0x10));
  sprintf((char *)&pFile,"%s_%s_names.txt",pcVar4,pcVar5);
  __stream = fopen((char *)&pFile,"wb");
  iVar1 = Abc_NtkObjNumMax((Abc_Ntk_t *)pFileName._992_8_);
  pVVar6 = Vec_IntStart(iVar1);
  *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8) = pVVar6;
  for (local_41c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pFileName._992_8_), local_41c < iVar1;
      local_41c = local_41c + 1) {
    pAVar7 = Abc_NtkCi((Abc_Ntk_t *)pFileName._992_8_,local_41c);
    pAVar8 = Abc_ObjFanout0(pAVar7);
    pcVar4 = Abc_ObjName(pAVar8);
    fprintf(__stream,"%s            \n",pcVar4);
    pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    uVar2 = Abc_ObjId(pAVar7);
    Vec_IntWriteEntry(pVVar6,uVar2,local_420 << 1);
    local_420 = local_420 + 1;
  }
  for (local_41c = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pFileName._992_8_), local_41c < iVar1;
      local_41c = local_41c + 1) {
    pAVar7 = Abc_NtkCo((Abc_Ntk_t *)pFileName._992_8_,local_41c);
    pAVar7 = Abc_ObjFanin0(pAVar7);
    pAVar7 = Abc_ObjFanin0(pAVar7);
    pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    uVar2 = Abc_ObjId(pAVar7);
    iVar1 = Vec_IntEntry(pVVar6,uVar2);
    if (iVar1 == 0) {
      pAVar8 = Abc_ObjFanout0(pAVar7);
      pcVar4 = Abc_ObjName(pAVar8);
      fprintf(__stream,"%s            \n",pcVar4);
      pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
      uVar2 = Abc_ObjId(pAVar7);
      Vec_IntWriteEntry(pVVar6,uVar2,local_420 << 1);
      local_420 = local_420 + 1;
    }
  }
  p_01 = Abc_NtkDfs((Abc_Ntk_t *)pFileName._992_8_,1);
  for (local_41c = 0; iVar1 = Vec_PtrSize(p_01), local_41c < iVar1; local_41c = local_41c + 1) {
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p_01,local_41c);
    pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    uVar2 = Abc_ObjId(pAVar7);
    iVar1 = Vec_IntEntry(pVVar6,uVar2);
    if (iVar1 == 0) {
      pAVar8 = Abc_ObjFanout0(pAVar7);
      pcVar4 = Abc_ObjName(pAVar8);
      fprintf(__stream,"%s            \n",pcVar4);
      pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
      uVar2 = Abc_ObjId(pAVar7);
      Vec_IntWriteEntry(pVVar6,uVar2,local_420 << 1);
      local_420 = local_420 + 1;
    }
  }
  Vec_PtrFree(p_01);
  fclose(__stream);
  for (local_41c = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pFileName._992_8_), local_41c < iVar1;
      local_41c = local_41c + 1) {
    pAVar7 = Abc_NtkCo((Abc_Ntk_t *)pFileName._992_8_,local_41c);
    pAVar8 = Abc_ObjFanin0(pAVar7);
    pAVar8 = Abc_ObjFanin0(pAVar8);
    pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    uVar2 = Abc_ObjId(pAVar7);
    p_00 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    i_00 = Abc_ObjId(pAVar8);
    iVar1 = Vec_IntEntry(p_00,i_00);
    Vec_IntWriteEntry(pVVar6,uVar2,iVar1);
    pVVar6 = *(Vec_Int_t **)(pFileName._992_8_ + 0x1b8);
    uVar2 = Abc_ObjId(pAVar8);
    Vec_IntWriteEntry(pVVar6,uVar2,0);
  }
  return;
}

Assistant:

void Abc_NtkStartNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, Counter = 1;
    assert( Abc_NtkIsNetlist(p) );
    assert( p->vNameIds == NULL );
    assert( strlen(p->pSpec) < 1000 );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "wb" );
    p->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(p) );
    // add inputs
    Abc_NtkForEachCi( p, pObj, i )
        fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    // add outputs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pFanin)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pFanin), 2*Counter++);
    }
    // add nodes in a topo order
    vNodes = Abc_NtkDfs( p, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    Vec_PtrFree( vNodes );
    fclose( pFile );
    // transfer driver node names to COs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pObj), Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) );
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pFanin), 0 );
    }
}